

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmInstruction *
anon_unknown.dwarf_f89de::GetCopyInfo
          (VmModule *module,VmValue *pointer,VmConstant *offset,uint accessSize)

{
  VmInstruction *pVVar1;
  VmConstant *pVVar2;
  LoadStoreInfo *pLVar3;
  uint uVar4;
  int iVar5;
  
  if (offset == (VmConstant *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = offset->iValue;
  }
  if ((pointer == (VmValue *)0x0) || (pointer->typeID != 1)) {
    for (uVar4 = 0; uVar4 < (module->loadStoreInfo).count; uVar4 = uVar4 + 1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,uVar4);
      pVVar1 = pLVar3->copyInst;
      if ((((pVVar1 != (VmInstruction *)0x0) &&
           (pLVar3->storePointer == pointer && pLVar3->storePointer != (VmValue *)0x0)) &&
          (pLVar3->storeOffset->iValue == iVar5)) && (pLVar3->accessSize == accessSize)) {
        if (pVVar1->parent != (VmBlock *)0x0) {
          return pVVar1;
        }
        __assert_fail("el.copyInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x701,
                      "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                     );
      }
    }
  }
  else if (pointer[1].comment.end != (char *)0x0) {
    if (iVar5 != 0) {
      __assert_fail("offsetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x6e6,
                    "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                   );
    }
    for (uVar4 = 0; uVar4 < (module->loadStoreInfo).count; uVar4 = uVar4 + 1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,uVar4);
      pVVar1 = pLVar3->copyInst;
      if (((pVVar1 != (VmInstruction *)0x0) &&
          (pVVar2 = pLVar3->storeAddress, pVVar2 != (VmConstant *)0x0)) &&
         ((pVVar2->container == (VariableData *)pointer[1].comment.end &&
          ((pVVar2->iValue == *(int *)&pointer[1]._vptr_VmValue &&
           (pLVar3->accessSize == accessSize)))))) {
        if (pVVar1->parent != (VmBlock *)0x0) {
          return pVVar1;
        }
        __assert_fail("el.copyInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x6f0,
                      "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                     );
      }
    }
  }
  return (VmInstruction *)0x0;
}

Assistant:

VmInstruction* GetCopyInfo(VmModule *module, VmValue *pointer, VmConstant *offset, unsigned accessSize)
	{
		int offsetValue = offset ? offset->iValue : 0;

		if(VmConstant *address = getType<VmConstant>(pointer))
		{
			if(!address->container)
				return NULL;

			assert(offsetValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storeAddress)
				{
					if(el.storeAddress->container == address->container && el.storeAddress->iValue == address->iValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storePointer)
				{
					if(el.storePointer == pointer && el.storeOffset->iValue == offsetValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}

		return NULL;
	}